

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  int iVar1;
  int in_ECX;
  char *pcVar2;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  sqlite3_int64 iSave;
  sqlite3_int64 iPos2;
  sqlite3_int64 iPos1;
  sqlite3_int64 iPrev;
  char *pSave;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char **in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char **local_70;
  char **local_68;
  char *local_58;
  uint local_50;
  uint local_4c;
  byte *local_48;
  byte *local_40;
  char *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  uint local_4;
  
  local_38 = (char *)*in_RDI;
  local_40 = (byte *)*in_R8;
  local_48 = (byte *)*in_R9;
  local_4c = 0;
  local_50 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (*local_40 == 1) {
    local_40 = local_40 + 1;
    if ((*local_40 & 0x80) == 0) {
      local_4c = (uint)*local_40;
      in_stack_ffffffffffffff84 = 1;
    }
    else {
      in_stack_ffffffffffffff84 = sqlite3Fts3GetVarint32((char *)local_40,(int *)&local_4c);
    }
    local_40 = local_40 + in_stack_ffffffffffffff84;
  }
  if (*local_48 == 1) {
    local_48 = local_48 + 1;
    if ((*local_48 & 0x80) == 0) {
      local_50 = (uint)*local_48;
      in_stack_ffffffffffffff80 = 1;
    }
    else {
      in_stack_ffffffffffffff80 = sqlite3Fts3GetVarint32((char *)local_48,(int *)&local_50);
    }
    local_48 = local_48 + in_stack_ffffffffffffff80;
  }
  do {
    while (local_4c != local_50) {
      if ((int)local_4c < (int)local_50) {
        fts3ColumnlistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78);
        if (*local_40 == 0) goto LAB_001c2b0e;
        local_40 = local_40 + 1;
        if ((*local_40 & 0x80) == 0) {
          local_4c = (uint)*local_40;
          in_stack_ffffffffffffff6c = 1;
        }
        else {
          in_stack_ffffffffffffff6c = sqlite3Fts3GetVarint32((char *)local_40,(int *)&local_4c);
        }
        local_40 = local_40 + in_stack_ffffffffffffff6c;
      }
      else {
        fts3ColumnlistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78);
        if (*local_48 == 0) goto LAB_001c2b0e;
        local_48 = local_48 + 1;
        if ((*local_48 & 0x80) == 0) {
          local_50 = (uint)*local_48;
          in_stack_ffffffffffffff68 = 1;
        }
        else {
          in_stack_ffffffffffffff68 = sqlite3Fts3GetVarint32((char *)local_48,(int *)&local_50);
        }
        local_48 = local_48 + in_stack_ffffffffffffff68;
      }
    }
    local_58 = local_38;
    if (local_4c != 0) {
      pcVar2 = local_38 + 1;
      *local_38 = '\x01';
      local_38 = pcVar2;
      iVar1 = sqlite3Fts3PutVarint(pcVar2,(long)(int)local_4c);
      local_38 = local_38 + iVar1;
    }
    fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (sqlite3_int64 *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_68 = (char **)0xfffffffffffffffe;
    fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (sqlite3_int64 *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_70 = (char **)0xfffffffffffffffe;
    while( true ) {
      while( true ) {
        if ((local_70 == (char **)((long)local_68 + (long)local_14)) ||
           (((local_1c == 0 && ((long)local_68 < (long)local_70)) &&
            ((long)local_70 <= (long)local_68 + (long)local_14)))) {
          in_stack_ffffffffffffff78 = local_70;
          if (local_18 != 0) {
            in_stack_ffffffffffffff78 = local_68;
          }
          fts3PutDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (sqlite3_int64 *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0x1c283f)
          ;
          local_58 = (char *)0x0;
        }
        if (((local_18 != 0) || ((long)local_68 + (long)local_14 < (long)local_70)) &&
           ((long)local_68 < (long)local_70)) break;
        if (((int)(char)*local_48 & 0xfeU) == 0) goto LAB_001c28ef;
        fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (sqlite3_int64 *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_70 = (char **)((long)local_70 + -2);
      }
      if (((int)(char)*local_40 & 0xfeU) == 0) break;
      fts3GetDeltaVarint((char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (sqlite3_int64 *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_68 = (char **)((long)local_68 + -2);
    }
LAB_001c28ef:
    if (local_58 != (char *)0x0) {
      local_38 = local_58;
    }
    fts3ColumnlistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    fts3ColumnlistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    if ((*local_40 == 0) || (*local_48 == 0)) {
LAB_001c2b0e:
      fts3PoslistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
      fts3PoslistCopy((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
      *local_28 = local_40;
      *local_30 = local_48;
      pcVar2 = (char *)*local_10;
      if (pcVar2 != local_38) {
        *local_38 = '\0';
        *local_10 = local_38 + 1;
      }
      local_4 = (uint)(pcVar2 != local_38);
      return local_4;
    }
    local_40 = local_40 + 1;
    if ((*local_40 & 0x80) == 0) {
      local_4c = (uint)*local_40;
      in_stack_ffffffffffffff74 = 1;
    }
    else {
      in_stack_ffffffffffffff74 = sqlite3Fts3GetVarint32((char *)local_40,(int *)&local_4c);
    }
    local_40 = local_40 + in_stack_ffffffffffffff74;
    local_48 = local_48 + 1;
    if ((*local_48 & 0x80) == 0) {
      local_50 = (uint)*local_48;
      in_stack_ffffffffffffff70 = 1;
    }
    else {
      in_stack_ffffffffffffff70 = sqlite3Fts3GetVarint32((char *)local_48,(int *)&local_50);
    }
    local_48 = local_48 + in_stack_ffffffffffffff70;
  } while( true );
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      assert( *p1!=POS_END && *p1!=POS_COLUMN );
      assert( *p2!=POS_END && *p2!=POS_COLUMN );
      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}